

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void gamma_end(png_structp ppIn,png_infop pi)

{
  undefined1 *puVar1;
  gamma_display *dp;
  
  dp = (gamma_display *)png_get_progressive_ptr();
  if ((dp->this).speed != 0) {
    puVar1 = &((dp->this).ps)->field_0x18;
    *puVar1 = *puVar1 | 0x80;
    return;
  }
  gamma_image_validate(dp,ppIn,pi);
  return;
}

Assistant:

static void PNGCBAPI
gamma_end(png_structp ppIn, png_infop pi)
{
   png_const_structp pp = ppIn;
   gamma_display *dp = voidcast(gamma_display*, png_get_progressive_ptr(pp));

   if (!dp->this.speed)
      gamma_image_validate(dp, pp, pi);
   else
      dp->this.ps->validated = 1;
}